

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateProfiledNewScObjArrayFastPath
          (Lowerer *this,Instr *instr,ArrayCallSiteInfo *arrayInfo,intptr_t arrayInfoAddr,
          intptr_t weakFuncRef,uint32 length,LabelInstr *labelDone,bool isNoArgs)

{
  Func *func;
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  LabelInstr *helperLabel;
  RegOpnd *pRVar2;
  ProfiledInstr *pPVar3;
  RegOpnd *pRVar4;
  IntConstOpnd *pIVar5;
  AddrOpnd *pAVar6;
  Opnd *pOVar7;
  ArrayCallSiteInfo *arrayInfo_00;
  ArrayCallSiteInfo *arrayInfo_01;
  uint i_2;
  uint i;
  uint uVar8;
  int iVar9;
  uint i_1;
  ulong value;
  uint32 local_38;
  byte local_32;
  bool local_31;
  uint32 size;
  bool isZeroed;
  
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  local_32 = Js::Phases::IsEnabled
                       ((Phases *)&DAT_01441eb0,ArrayCtorFastPathPhase,sourceContextId,functionId);
  if ((bool)local_32) goto LAB_0056462d;
  func = this->m_func;
  helperLabel = IR::LabelInstr::New(Label,func,true);
  local_31 = false;
  local_38 = length;
  pRVar2 = IR::Opnd::AsRegOpnd(instr->m_dst);
  pPVar3 = IR::Instr::AsProfiledInstr(instr);
  if (arrayInfo == (ArrayCallSiteInfo *)0x0) {
LAB_005645b5:
    pRVar2 = GenerateArrayObjectsAlloc<Js::JavascriptArray>
                       (this,instr,&local_38,arrayInfo,&local_31,isNoArgs);
    iVar9 = 0x18;
    for (uVar8 = 0; uVar8 < local_38; uVar8 = uVar8 + 1) {
      pOVar7 = GetMissingItemOpnd(TyVar,this->m_func);
      GenerateMemInit(this,pRVar2,iVar9,pOVar7,instr,false);
      iVar9 = iVar9 + 8;
    }
  }
  else {
    value = (ulong)(pPVar3->u).field_3.fldInfoData.f1;
    bVar1 = Js::ArrayCallSiteInfo::IsNativeIntArray(arrayInfo);
    if (bVar1) {
      GenerateArrayInfoIsNativeIntArrayTest(this,instr,arrayInfo_00,arrayInfoAddr,helperLabel);
      pRVar4 = GenerateArrayObjectsAlloc<Js::JavascriptNativeIntArray>
                         (this,instr,&local_38,arrayInfo,&local_31,isNoArgs);
      pIVar5 = IR::IntConstOpnd::New(value,TyUint16,func,true);
      GenerateMemInit(this,pRVar2,0x1a,&pIVar5->super_Opnd,instr,false);
      pAVar6 = IR::AddrOpnd::New(weakFuncRef,AddrOpndKindDynamicFunctionBodyWeakRef,this->m_func,
                                 false,(Var)0x0);
      GenerateMemInit(this,pRVar2,0x38,&pAVar6->super_Opnd,instr,false);
      iVar9 = 0x18;
      for (uVar8 = 0; uVar8 < local_38; uVar8 = uVar8 + 1) {
        GenerateMemInit(this,pRVar4,iVar9,-0x7fffe,instr,local_31);
        iVar9 = iVar9 + 4;
      }
    }
    else {
      bVar1 = Js::ArrayCallSiteInfo::IsNativeFloatArray(arrayInfo);
      if (!bVar1) goto LAB_005645b5;
      GenerateArrayInfoIsNativeFloatAndNotIntArrayTest
                (this,instr,arrayInfo_01,arrayInfoAddr,helperLabel);
      pRVar4 = GenerateArrayObjectsAlloc<Js::JavascriptNativeFloatArray>
                         (this,instr,&local_38,arrayInfo,&local_31,isNoArgs);
      pIVar5 = IR::IntConstOpnd::New(value,TyUint16,func,true);
      GenerateMemInit(this,pRVar2,0x1a,&pIVar5->super_Opnd,instr,false);
      pAVar6 = IR::AddrOpnd::New(weakFuncRef,AddrOpndKindDynamicFunctionBodyWeakRef,this->m_func,
                                 false,(Var)0x0);
      GenerateMemInit(this,pRVar2,0x38,&pAVar6->super_Opnd,instr,false);
      iVar9 = 0x18;
      for (uVar8 = 0; uVar8 < local_38; uVar8 = uVar8 + 1) {
        pOVar7 = GetMissingItemOpndForAssignment(TyFloat64,this->m_func);
        GenerateMemInit(this,pRVar4,iVar9,pOVar7,instr,false);
        iVar9 = iVar9 + 8;
      }
    }
  }
  InsertBranch(Br,labelDone,instr);
  IR::Instr::InsertBefore(instr,&helperLabel->super_Instr);
LAB_0056462d:
  return (bool)(local_32 ^ 1);
}

Assistant:

bool
Lowerer::GenerateProfiledNewScObjArrayFastPath(IR::Instr *instr, Js::ArrayCallSiteInfo * arrayInfo, intptr_t arrayInfoAddr, intptr_t weakFuncRef, uint32 length, IR::LabelInstr* labelDone, bool isNoArgs)
{
    if (PHASE_OFF(Js::ArrayCtorFastPathPhase, m_func))
    {
        return false;
    }

    Func * func = this->m_func;
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
    uint32 size = length;
    bool isZeroed = false;
    IR::RegOpnd *dstOpnd = instr->GetDst()->AsRegOpnd();
    IR::RegOpnd *headOpnd;
    Js::ProfileId profileId = static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId);
    if (arrayInfo && arrayInfo->IsNativeIntArray())
    {
        GenerateArrayInfoIsNativeIntArrayTest(instr, arrayInfo, arrayInfoAddr, helperLabel);
        Assert(Js::JavascriptNativeIntArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex());
        headOpnd = GenerateArrayObjectsAlloc<Js::JavascriptNativeIntArray>(instr, &size, arrayInfo, &isZeroed, isNoArgs);

        GenerateMemInit(dstOpnd, Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex(), IR::IntConstOpnd::New(profileId, TyUint16, func, true), instr, isZeroed);
        GenerateMemInit(dstOpnd, Js::JavascriptNativeIntArray::GetOffsetOfWeakFuncRef(), IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func), instr, isZeroed);
        for (uint i = 0; i < size; i++)
        {
            GenerateMemInit(headOpnd, sizeof(Js::SparseArraySegmentBase) + i * sizeof(int32),
                            Js::JavascriptNativeIntArray::MissingItem, instr, isZeroed);
        }
    }
    else if (arrayInfo && arrayInfo->IsNativeFloatArray())
    {
        GenerateArrayInfoIsNativeFloatAndNotIntArrayTest(instr, arrayInfo, arrayInfoAddr, helperLabel);
        Assert(Js::JavascriptNativeFloatArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex());
        headOpnd = GenerateArrayObjectsAlloc<Js::JavascriptNativeFloatArray>(instr, &size, arrayInfo, &isZeroed, isNoArgs);

        GenerateMemInit(dstOpnd, Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex(), IR::IntConstOpnd::New(profileId, TyUint16, func, true), instr, isZeroed);
        GenerateMemInit(dstOpnd, Js::JavascriptNativeFloatArray::GetOffsetOfWeakFuncRef(), IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func), instr, isZeroed);

        // Js::JavascriptArray::MissingItem is a Var, so it may be 32-bit or 64 bit.
        uint const offsetStart = sizeof(Js::SparseArraySegmentBase);
        for (uint i = 0; i < size; i++)
        {
            GenerateMemInit(
                headOpnd, offsetStart + i * sizeof(double),
                GetMissingItemOpndForAssignment(TyFloat64, m_func),
                instr, isZeroed);
        }
    }
    else
    {
        uint const offsetStart = sizeof(Js::SparseArraySegmentBase);
        headOpnd = GenerateArrayObjectsAlloc<Js::JavascriptArray>(instr, &size, arrayInfo, &isZeroed, isNoArgs);
        for (uint i = 0; i < size; i++)
        {
             GenerateMemInit(
                headOpnd, offsetStart + i * sizeof(Js::Var),
                GetMissingItemOpndForAssignment(TyVar, m_func),
                instr, isZeroed);
        }
    }

    // Skip pass the helper call
    InsertBranch(Js::OpCode::Br, labelDone, instr);
    instr->InsertBefore(helperLabel);
    return true;
}